

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLi(Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,
                   int flags)

{
  Expression *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Head_base<0UL,_CAssemblerCommand_*,_false> _Var4;
  int32_t iVar5;
  undefined4 in_register_0000000c;
  MipsImmediateData *immediates_00;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  uint in_R8D;
  char *pcVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  initializer_list<AssemblyTemplateArgument> variables;
  string macroText;
  ExpressionValue value;
  undefined1 local_118 [40];
  MipsRegisterData *local_f0;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_e8;
  Expression *local_e0;
  MipsImmediateData *local_d8;
  undefined1 local_d0 [8];
  anon_union_8_2_b358304e_for_ExpressionValue_1 local_c8;
  _Alloc_hider local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  char *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  string local_50;
  
  immediates_00 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  this = &(immediates_00->secondary).expression;
  local_d8 = immediates;
  if ((immediates_00->secondary).expression.constExpression == true) {
    Expression::evaluate((ExpressionValue *)local_d0,this);
    if (local_d0._0_4_ == Float) {
      iVar5 = getFloatBits((float)local_c8.floatValue);
      createConstExpression((Expression *)local_118,(long)iVar5);
      uVar3 = local_118._8_8_;
      uVar2 = local_118._0_8_;
      local_118._0_8_ = (element_type *)0x0;
      local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (immediates_00->secondary).expression.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (immediates_00->secondary).expression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      (immediates_00->secondary).expression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      (immediates_00->secondary).expression.constExpression = (bool)local_118[0x10];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
    }
    if (local_c0._M_p != local_d0 + 0x20) {
      operator_delete(local_c0._M_p,local_b0._0_8_ + 1);
    }
  }
  local_f0 = registers;
  local_e8._M_head_impl = (CAssemblerCommand *)parser;
  local_e0 = this;
  preprocessMacro_abi_cxx11_
            ((string *)local_118,
             "\n\t\t.if abs(%imm%) > 0xFFFFFFFF\n\t\t\t.error \"Immediate value too big\"\n\t\t.elseif %imm% & ~0xFFFF\n\t\t\t.if (%imm% & 0xFFFF8000) == 0xFFFF8000\n\t\t\t\t.if %lower%\n\t\t\t\t\taddiu\t%rs%,r0, lo(%imm%)\n\t\t\t\t.endif\n\t\t\t.elseif (%imm% & 0xFFFF) == 0\n\t\t\t\t.if %upper%\n\t\t\t\t\tlui\t\t%rs%, hi(%imm%)\n\t\t\t\t.elseif %lower%\n\t\t\t\t\tnop\n\t\t\t\t.endif\n\t\t\t.else\n\t\t\t\t.if %upper%\n\t\t\t\t\tlui\t\t%rs%, hi(%imm%)\n\t\t\t\t.endif\n\t\t\t\t.if %lower%\n\t\t\t\t\taddiu \t%rs%, lo(%imm%)\n\t\t\t\t.endif\n\t\t\t.endif\n\t\t.else\n\t\t\t.if %lower%\n\t\t\t\tori\t\t%rs%,r0,%imm%\n\t\t\t.endif\n\t\t.endif\n\t"
             ,immediates_00);
  bVar12 = (in_R8D >> 0xe & 1) == 0;
  pcVar9 = "1";
  pcVar8 = "1";
  if (bVar12) {
    pcVar8 = "0";
  }
  local_d0 = (undefined1  [8])0x1936c4;
  local_c8.intValue = (long)local_d0 + 0x18;
  pcVar10 = "";
  pcVar6 = "";
  if (bVar12) {
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_d0 + 8),pcVar8,pcVar6);
  local_b0._8_8_ = "%lower%";
  bVar12 = -1 < (short)in_R8D;
  if (bVar12) {
    pcVar9 = "0";
  }
  local_a0[0] = local_90;
  if (bVar12) {
    pcVar10 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,pcVar9,pcVar10);
  local_80 = "%rs%";
  local_78[0] = local_68;
  peVar1 = (local_d8->primary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,peVar1,
             (long)&((local_d8->primary).expression.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  local_58 = "%imm%";
  Expression::toString_abi_cxx11_(&local_50,local_e0);
  _Var4._M_head_impl = local_e8._M_head_impl;
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)local_d0;
  createMacro((Parser *)local_e8._M_head_impl,(string *)local_f0,(int)local_118,variables);
  lVar7 = -0xa0;
  paVar11 = &local_50.field_2;
  do {
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar11->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                      paVar11->_M_allocated_capacity + 1);
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar11->_M_allocated_capacity + -5);
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0);
  if ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,CONCAT71(local_118._17_7_,local_118[0x10]) + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         _Var4._M_head_impl;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLi(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLi = R"(
		.if abs(%imm%) > 0xFFFFFFFF
			.error "Immediate value too big"
		.elseif %imm% & ~0xFFFF
			.if (%imm% & 0xFFFF8000) == 0xFFFF8000
				.if %lower%
					addiu	%rs%,r0, lo(%imm%)
				.endif
			.elseif (%imm% & 0xFFFF) == 0
				.if %upper%
					lui		%rs%, hi(%imm%)
				.elseif %lower%
					nop
				.endif
			.else
				.if %upper%
					lui		%rs%, hi(%imm%)
				.endif
				.if %lower%
					addiu 	%rs%, lo(%imm%)
				.endif
			.endif
		.else
			.if %lower%
				ori		%rs%,r0,%imm%
			.endif
		.endif
	)";

	// floats need to be treated as integers, convert them
	if (immediates.secondary.expression.isConstExpression())
	{
		ExpressionValue value = immediates.secondary.expression.evaluate();
		if (value.isFloat())
		{
			int32_t newValue = getFloatBits((float)value.floatValue);
			immediates.secondary.expression = createConstExpression(newValue);
		}
	}

	std::string macroText = preprocessMacro(templateLi,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%upper%",	(flags & MIPSM_UPPER) ? "1" : "0" },
			{ "%lower%",	(flags & MIPSM_LOWER) ? "1" : "0" },
			{ "%rs%",		registers.grs.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
	});
}